

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O0

int consume_response_line(http1_fio_parser_args_s *args,uint8_t *start,uint8_t *end)

{
  code *pcVar1;
  undefined8 uVar2;
  uint8_t uVar3;
  int iVar4;
  long lVar5;
  uint8_t *local_30;
  uint8_t *tmp;
  uint8_t *end_local;
  uint8_t *start_local;
  http1_fio_parser_args_s *args_local;
  
  (args->parser->state).reserved = (args->parser->state).reserved | 0x80;
  local_30 = start;
  tmp = end;
  end_local = start;
  start_local = (uint8_t *)args;
  uVar3 = seek2ch(&local_30,end,' ');
  if (uVar3 == '\0') {
    args_local._4_4_ = -1;
  }
  else {
    iVar4 = (**(code **)(start_local + 0x48))
                      (*(undefined8 *)start_local,end_local,(long)local_30 - (long)end_local);
    if (iVar4 == 0) {
      local_30 = local_30 + 1;
      end_local = local_30;
      uVar3 = seek2ch(&local_30,tmp,' ');
      if (uVar3 == '\0') {
        args_local._4_4_ = -1;
      }
      else {
        pcVar1 = *(code **)(start_local + 0x30);
        uVar2 = *(undefined8 *)start_local;
        lVar5 = atol((char *)end_local);
        iVar4 = (*pcVar1)(uVar2,lVar5,local_30 + 1,(long)tmp - (long)local_30);
        if (iVar4 == 0) {
          args_local._4_4_ = 0;
        }
        else {
          args_local._4_4_ = -1;
        }
      }
    }
    else {
      args_local._4_4_ = -1;
    }
  }
  return args_local._4_4_;
}

Assistant:

inline static int consume_response_line(struct http1_fio_parser_args_s *args,
                                        uint8_t *start, uint8_t *end) {
  args->parser->state.reserved |= 128;
  uint8_t *tmp = start;
  if (!seek2ch(&tmp, end, ' '))
    return -1;
  if (args->on_http_version(args->parser, (char *)start, tmp - start))
    return -1;
  tmp = start = tmp + 1;
  if (!seek2ch(&tmp, end, ' '))
    return -1;
  if (args->on_status(args->parser, atol((char *)start), (char *)(tmp + 1),
                      end - tmp))
    return -1;
  return 0;
}